

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiViewport * ImGui::FindViewportByID(ImGuiID id)

{
  ImGuiViewportP_conflict1 **ppIVar1;
  ImVector<ImGuiViewportP_*> *this;
  int n;
  int i;
  
  this = &GImGui->Viewports;
  i = 0;
  while( true ) {
    if (this->Size <= i) {
      return (ImGuiViewport *)0x0;
    }
    ppIVar1 = ImVector<ImGuiViewportP_*>::operator[](this,i);
    if (((*ppIVar1)->super_ImGuiViewport).ID == id) break;
    i = i + 1;
  }
  ppIVar1 = ImVector<ImGuiViewportP_*>::operator[](this,i);
  return &(*ppIVar1)->super_ImGuiViewport;
}

Assistant:

ImGuiViewport* ImGui::FindViewportByID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int n = 0; n < g.Viewports.Size; n++)
        if (g.Viewports[n]->ID == id)
            return g.Viewports[n];
    return NULL;
}